

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::XmlReporter::subcase_start(XmlReporter *this,SubcaseSignature *in)

{
  XmlWriter *this_00;
  char *attribute;
  allocator aStack_a8;
  allocator local_a7;
  allocator local_a6;
  allocator local_a5;
  uint local_a4;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::mutex::lock(&this->mutex);
  std::__cxx11::string::string((string *)&local_40,"SubCase",&local_a5);
  this_00 = &this->xml;
  XmlWriter::startElement(this_00,&local_40);
  std::__cxx11::string::string((string *)&local_60,"name",&local_a6);
  XmlWriter::writeAttribute<doctest::String>(this_00,&local_60,&in->m_name);
  std::__cxx11::string::string((string *)&local_80,"filename",&local_a7);
  attribute = skipPathFromFilename(in->m_file);
  XmlWriter::writeAttribute(this_00,&local_80,attribute);
  std::__cxx11::string::string((string *)&local_a0,"line",&aStack_a8);
  local_a4 = 0;
  if (this->opt->no_line_numbers == false) {
    local_a4 = in->m_line;
  }
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_a0,&local_a4);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  XmlWriter::ensureTagClosed(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& in) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("SubCase")
                    .writeAttribute("name", in.m_name)
                    .writeAttribute("filename", skipPathFromFilename(in.m_file))
                    .writeAttribute("line", line(in.m_line));
            xml.ensureTagClosed();
        }